

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.h
# Opt level: O3

void __thiscall LinkList<Statistic>::Delete(LinkList<Statistic> *this,int which)

{
  InternalNode *pIVar1;
  char *pcVar2;
  InternalNode *pIVar3;
  int iVar4;
  InternalNode *pIVar5;
  
  if (which == 0) {
    return;
  }
  if (this->iLength < which) {
    return;
  }
  pIVar3 = this->pnHead;
  pIVar5 = pIVar3;
  if (which < 2) {
LAB_00106c04:
    pIVar3 = pIVar5->next;
    if (pIVar3 == (InternalNode *)0x0) {
      pcVar2 = (pIVar5->Data).psKey;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
LAB_00106c52:
      operator_delete(pIVar5);
      this->iLength = 0;
      this->pnHead = (InternalNode *)0x0;
      this->pnTail = (InternalNode *)0x0;
      this->pnLastRef = (InternalNode *)0x0;
      this->iLastRef = -1;
      return;
    }
    this->pnHead = pIVar3;
    pIVar3->previous = (InternalNode *)0x0;
    pcVar2 = (pIVar5->Data).psKey;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    operator_delete(pIVar5);
    pIVar3 = this->pnHead;
  }
  else {
    iVar4 = which + -1;
    do {
      pIVar5 = pIVar5->next;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    if (pIVar5 == pIVar3) goto LAB_00106c04;
    if (pIVar5 != this->pnTail) {
      pIVar3 = pIVar5->next;
      this->pnLastRef = pIVar3;
      pIVar1 = pIVar5->previous;
      pIVar1->next = pIVar3;
      pIVar3->previous = pIVar1;
      pcVar2 = (pIVar5->Data).psKey;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      operator_delete(pIVar5);
      goto LAB_00106c36;
    }
    pIVar3 = pIVar5->previous;
    if (pIVar3 == (InternalNode *)0x0) {
      pcVar2 = (pIVar5->Data).psKey;
      if (pcVar2 != (char *)0x0) {
        operator_delete__(pcVar2);
      }
      goto LAB_00106c52;
    }
    this->pnTail = pIVar3;
    pIVar3->next = (InternalNode *)0x0;
    pcVar2 = (pIVar5->Data).psKey;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
    operator_delete(pIVar5);
    pIVar3 = this->pnTail;
  }
  this->pnLastRef = pIVar3;
LAB_00106c36:
  if (this->iLength != 0) {
    this->iLength = this->iLength + -1;
  }
  return;
}

Assistant:

inline void LinkList<T>::Delete(int which)
{
   if (which>iLength || which == 0)
      return;

   InternalNode *pnDeleteMe = pnHead;

   for (int i=1; i<which; i++)
      pnDeleteMe = pnDeleteMe->next;

   if (pnDeleteMe == pnHead)
   {
      if (pnDeleteMe->next == NULL)
      {
         delete pnDeleteMe;
         SetNull();
      }
      else
      {
         pnHead = pnDeleteMe->next;
         pnHead->previous = NULL;
         delete pnDeleteMe;
         pnLastRef = pnHead;
      }
   }
   else
   {
      if (pnDeleteMe == pnTail)
      {
         if (pnDeleteMe->previous == NULL)
         {
            delete pnDeleteMe;
            SetNull();
         }
         else
         {
            pnTail = pnDeleteMe->previous;
            pnTail->next = NULL;
            delete pnDeleteMe;
            pnLastRef = pnTail;
         }
      }
      else
      {
         pnLastRef = pnDeleteMe->next;
         pnDeleteMe->previous->next = pnDeleteMe->next;
         pnDeleteMe->next->previous = pnDeleteMe->previous;
         delete pnDeleteMe;
      }
   }

   if (iLength!=0)
      --iLength;
}